

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::TextureVkImpl::TextureVkImpl
          (TextureVkImpl *this,IReferenceCounters *pRefCounters,
          FixedBlockMemoryAllocator *TexViewObjAllocator,RenderDeviceVkImpl *pDeviceVk,
          TextureDesc *TexDesc,RESOURCE_STATE InitialState,VkImage VkImageHandle)

{
  TextureBase<Diligent::EngineVkImplTraits>::TextureBase
            (&this->super_TextureBase<Diligent::EngineVkImplTraits>,pRefCounters,TexViewObjAllocator
             ,pDeviceVk,TexDesc,false);
  (this->super_TextureBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>.
  super_ObjectBase<Diligent::ITextureVk>.super_RefCountedObject<Diligent::ITextureVk>.
  super_ITextureVk.super_ITexture.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_00938c98;
  (this->m_VulkanImage).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_VulkanImage).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_VulkanImage).m_VkObject = VkImageHandle;
  (this->m_StagingBuffer).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_StagingBuffer).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_StagingBuffer).m_VkObject = (VkBuffer_T *)0x0;
  (this->m_MemoryAllocation).Page = (VulkanMemoryPage *)0x0;
  (this->m_MemoryAllocation).UnalignedOffset = 0;
  (this->m_MemoryAllocation).Size = 0;
  this->m_StagingDataAlignedOffset = 0;
  (this->super_TextureBase<Diligent::EngineVkImplTraits>).m_State = InitialState;
  if ((this->super_TextureBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
      .m_Desc.Usage == USAGE_SPARSE) {
    InitSparseProperties(this);
  }
  return;
}

Assistant:

TextureVkImpl::TextureVkImpl(IReferenceCounters*        pRefCounters,
                             FixedBlockMemoryAllocator& TexViewObjAllocator,
                             RenderDeviceVkImpl*        pDeviceVk,
                             const TextureDesc&         TexDesc,
                             RESOURCE_STATE             InitialState,
                             VkImage                    VkImageHandle) :
    TTextureBase{pRefCounters, TexViewObjAllocator, pDeviceVk, TexDesc},
    m_VulkanImage{VkImageHandle}
{
    SetState(InitialState);

    if (m_Desc.Usage == USAGE_SPARSE)
        InitSparseProperties();
}